

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action Search::choose_oracle_action
                 (search_private *priv,size_t ec_cnt,action *oracle_actions,
                 size_t oracle_actions_cnt,action *allowed_actions,size_t allowed_actions_cnt,
                 float *allowed_actions_cost)

{
  bool bVar1;
  float *pfVar2;
  long lVar3;
  v_array<Search::action_cache> *__s;
  polylabel *__src;
  ulong in_RCX;
  action *in_RDX;
  search_private *in_RDI;
  float *in_R8;
  ulong in_R9;
  float fVar4;
  long in_stack_00000008;
  float cost;
  action cl;
  size_t k_3;
  size_t K_1;
  polylabel l;
  v_array<Search::action_cache> *this_cache;
  size_t i;
  size_t k_2;
  size_t count;
  size_t k_1;
  float min_cost;
  size_t k;
  size_t K;
  action a;
  polylabel *in_stack_fffffffffffffeb8;
  v_array<Search::action_cache> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  action *in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  search_private *in_stack_ffffffffffffff00;
  ulong local_f0;
  action_cache local_e8;
  float local_d8;
  float local_d4;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [40];
  action_cache *local_98;
  action_cache *local_90;
  action_cache *local_88;
  size_t local_80;
  v_array<Search::action_cache> *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  float local_4c;
  ulong local_48;
  ulong local_40;
  float local_34;
  ulong local_30;
  float *local_28;
  ulong local_20;
  action *local_18;
  search_private *local_8;
  
  local_34 = -NAN;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((in_RDI->use_action_costs & 1U) != 0) {
    local_f0 = in_R9;
    if (in_R8 == (float *)0x0) {
      local_f0 = in_RDI->A;
    }
    local_40 = local_f0;
    for (local_48 = 0; local_48 < local_f0; local_48 = local_48 + 1) {
    }
    local_4c = 3.4028235e+38;
    for (local_58 = 0; local_58 < local_40; local_58 = local_58 + 1) {
      pfVar2 = std::min<float>(&local_4c,(float *)(in_stack_00000008 + local_58 * 4));
      local_4c = *pfVar2;
    }
    if (local_4c < 3.4028235e+38) {
      local_60 = 0;
      for (local_68 = 0; local_68 < local_40; local_68 = local_68 + 1) {
        if (*(float *)(in_stack_00000008 + local_68 * 4) <= local_4c) {
          local_60 = local_60 + 1;
          if (local_60 != 1) {
            fVar4 = merand48((uint64_t *)in_stack_fffffffffffffec0);
            in_stack_ffffffffffffff00 = (search_private *)(double)fVar4;
            if (1.0 / (double)local_60 <= (double)in_stack_ffffffffffffff00) goto LAB_003b28a3;
          }
          if (local_28 == (float *)0x0) {
            in_stack_fffffffffffffefc = (float)((int)local_68 + 1);
            local_34 = in_stack_fffffffffffffefc;
          }
          else {
            in_stack_fffffffffffffefc = local_28[local_68];
            local_34 = in_stack_fffffffffffffefc;
          }
        }
LAB_003b28a3:
      }
    }
  }
  if (local_34 == -NAN) {
    if (((0.0 < local_8->perturb_oracle) && (local_8->state == INIT_TRAIN)) &&
       (fVar4 = merand48((uint64_t *)in_stack_fffffffffffffec0), fVar4 < local_8->perturb_oracle)) {
      local_20 = 0;
    }
    if (local_20 == 0) {
      if (local_30 == 0) {
        if ((local_8->is_ldf & 1U) == 0) {
          lVar3 = random();
          in_stack_fffffffffffffeec = (float)((int)lVar3 + 1);
          in_stack_fffffffffffffef8 = in_stack_fffffffffffffeec;
          local_34 = in_stack_fffffffffffffeec;
        }
        else {
          lVar3 = random();
          in_stack_fffffffffffffeec = (float)lVar3;
          in_stack_fffffffffffffef8 = in_stack_fffffffffffffeec;
          local_34 = in_stack_fffffffffffffeec;
        }
      }
      else {
        lVar3 = random();
        in_stack_fffffffffffffeec = local_28[lVar3];
        in_stack_fffffffffffffee0 = local_28;
        in_stack_fffffffffffffef8 = in_stack_fffffffffffffeec;
        local_34 = in_stack_fffffffffffffeec;
      }
    }
    else {
      in_stack_fffffffffffffef0 = local_18;
      lVar3 = random();
      local_34 = (float)in_stack_fffffffffffffef0[lVar3];
      in_stack_fffffffffffffef8 = local_34;
    }
  }
  for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
  }
  bVar1 = need_memo_foreach_action(local_8);
  if ((bVar1) && (local_8->state == INIT_TRAIN)) {
    __s = (v_array<Search::action_cache> *)operator_new(0x20);
    memset(__s,0,0x20);
    local_78 = __s;
    v_init<Search::action_cache>();
    local_78->_begin = local_98;
    local_78->_end = local_90;
    local_78->end_array = local_88;
    local_78->erase_count = local_80;
    __src = allowed_actions_to_ld
                      (in_stack_ffffffffffffff00,
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       in_stack_fffffffffffffef0,
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0);
    memcpy(local_c0,__src,0x28);
    local_c8 = cs_get_costs_size(SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0),
                                 in_stack_fffffffffffffeb8);
    for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
      local_d4 = (float)cs_get_cost_index(SUB81((ulong)__s >> 0x38,0),
                                          (polylabel *)
                                          CONCAT44(in_stack_fffffffffffffecc,
                                                   in_stack_fffffffffffffec8),
                                          (size_t)in_stack_fffffffffffffec0);
      bVar1 = array_contains<unsigned_int>((uint)local_d4,local_18,local_20);
      in_stack_fffffffffffffec8 = 0x3f800000;
      in_stack_fffffffffffffecc = 0.0;
      if (!bVar1) {
        in_stack_fffffffffffffecc = 1.0;
      }
      in_stack_fffffffffffffec0 = local_78;
      local_d8 = in_stack_fffffffffffffecc;
      action_cache::action_cache
                (&local_e8,0.0,(action)local_d4,local_d4 == local_34,in_stack_fffffffffffffecc);
      v_array<Search::action_cache>::push_back
                (in_stack_fffffffffffffec0,(action_cache *)&in_stack_fffffffffffffeb8->simple);
    }
    v_array<v_array<Search::action_cache>_*>::push_back
              ((v_array<v_array<Search::action_cache>_*> *)in_stack_fffffffffffffec0,
               (v_array<Search::action_cache> **)&in_stack_fffffffffffffeb8->multi);
  }
  return (action)local_34;
}

Assistant:

action choose_oracle_action(search_private& priv, size_t ec_cnt, const action* oracle_actions,
    size_t oracle_actions_cnt, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost)
{
  action a = (action)-1;
  if (priv.use_action_costs)
  {
    size_t K = (allowed_actions == nullptr) ? priv.A : allowed_actions_cnt;
    cdbg << "costs = [";
    for (size_t k = 0; k < K; k++) cdbg << ' ' << allowed_actions_cost[k];
    cdbg << " ]" << endl;
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++) min_cost = min(min_cost, allowed_actions_cost[k]);
    cdbg << "min_cost = " << min_cost;
    if (min_cost < FLT_MAX)
    {
      size_t count = 0;
      for (size_t k = 0; k < K; k++)
        if (allowed_actions_cost[k] <= min_cost)
        {
          cdbg << ", hit @ " << k;
          count++;
          if ((count == 1) || (merand48(priv.all->random_state) < 1. / (float)count))
          {
            a = (allowed_actions == nullptr) ? (uint32_t)(k + 1) : allowed_actions[k];
            cdbg << "***";
          }
        }
    }
    cdbg << endl;
  }

  if (a == (action)-1)
  {
    if ((priv.perturb_oracle > 0.) && (priv.state == INIT_TRAIN) &&
        (merand48(priv.all->random_state) < priv.perturb_oracle))
      oracle_actions_cnt = 0;
    a = (oracle_actions_cnt > 0)
        ? oracle_actions[random(priv.all->random_state, oracle_actions_cnt)]
        : (allowed_actions_cnt > 0) ? allowed_actions[random(priv.all->random_state, allowed_actions_cnt)]
                                    : priv.is_ldf ? (action)random(priv.all->random_state, ec_cnt)
                                                  : (action)(1 + random(priv.all->random_state, priv.A));
  }
  cdbg << "choose_oracle_action from oracle_actions = [";
  for (size_t i = 0; i < oracle_actions_cnt; i++) cdbg << " " << oracle_actions[i];
  cdbg << " ], ret=" << a << endl;
  if (need_memo_foreach_action(priv) && (priv.state == INIT_TRAIN))
  {
    v_array<action_cache>* this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
    // TODO we don't really need to construct this polylabel
    polylabel l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    size_t K = cs_get_costs_size(priv.cb_learner, l);
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, l, k);
      float cost = array_contains(cl, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f;
      this_cache->push_back(action_cache(0., cl, cl == a, cost));
    }
    assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
    priv.memo_foreach_action.push_back(this_cache);
    cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << " from oracle" << endl;
  }
  return a;
}